

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O0

void __thiscall
HighsMatrixSlice<HighsTripletTreeSliceInOrder>::iterator::iterator
          (iterator *this,HighsInt *nodeIndex,double *nodeValue,HighsInt *nodeLeft,
          HighsInt *nodeRight,HighsInt node)

{
  vector<int,_std::allocator<int>_> *in_RCX;
  double *in_RDX;
  HighsInt *in_RSI;
  HighsSliceNonzero *in_RDI;
  double *in_R8;
  undefined4 in_R9D;
  value_type_conflict2 *in_stack_ffffffffffffffa8;
  HighsSliceNonzero *__x;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffc4;
  
  HighsSliceNonzero::HighsSliceNonzero(in_RDI,in_RSI,in_RDX);
  in_RDI[1].index_ = (HighsInt *)in_RCX;
  in_RDI[1].value_ = in_R8;
  __x = in_RDI + 2;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x72c930);
  *(undefined4 *)&in_RDI[3].value_ = in_R9D;
  std::vector<int,_std::allocator<int>_>::reserve(in_RCX,(size_type)in_R8);
  uVar1 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_RDI,in_stack_ffffffffffffffa8);
  if (*(int *)&in_RDI[3].value_ != -1) {
    while (*(int *)((long)&(in_RCX->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + (long)*(int *)&in_RDI[3].value_ * 4)
           != -1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),
                 (value_type_conflict2 *)__x);
      *(undefined4 *)&in_RDI[3].value_ =
           *(undefined4 *)
            ((long)&(in_RCX->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start + (long)*(int *)&in_RDI[3].value_ * 4);
    }
    in_RDI->index_ = in_RDI->index_ + *(int *)&in_RDI[3].value_;
    in_RDI->value_ = in_RDI->value_ + *(int *)&in_RDI[3].value_;
  }
  return;
}

Assistant:

iterator(const HighsInt* nodeIndex, const double* nodeValue,
             const HighsInt* nodeLeft, const HighsInt* nodeRight, HighsInt node)
        : pos_(nodeIndex, nodeValue),
          nodeLeft(nodeLeft),
          nodeRight(nodeRight),
          currentNode(node) {
      stack.reserve(16);
      stack.push_back(-1);
      if (currentNode == -1) return;
      while (nodeLeft[currentNode] != -1) {
        stack.push_back(currentNode);
        currentNode = nodeLeft[currentNode];
      }

      pos_.index_ += currentNode;
      pos_.value_ += currentNode;
    }